

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenTableGetSetTable(BinaryenExpressionRef expr,char *table)

{
  Name local_28;
  
  if (expr->_id != TableGetId) {
    __assert_fail("expression->is<TableGet>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x9b8,"void BinaryenTableGetSetTable(BinaryenExpressionRef, const char *)");
  }
  if (table != (char *)0x0) {
    wasm::Name::Name(&local_28,table);
    *(size_t *)(expr + 1) = local_28.super_IString.str._M_len;
    expr[1].type.id = (uintptr_t)local_28.super_IString.str._M_str;
    return;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x9b9,"void BinaryenTableGetSetTable(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenTableGetSetTable(BinaryenExpressionRef expr, const char* table) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TableGet>());
  assert(table);
  static_cast<TableGet*>(expression)->table = table;
}